

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# einsum.cpp
# Opt level: O1

int __thiscall ncnn::Einsum::load_param(Einsum *this,ParamDict *pd)

{
  Einsum *pEVar1;
  pointer pbVar2;
  int *piVar3;
  undefined8 this_00;
  int iVar4;
  char *pcVar5;
  char *__s;
  size_t sVar6;
  long lVar7;
  size_type sVar8;
  ulong uVar9;
  ulong uVar10;
  size_type sVar11;
  bool bVar12;
  string equation;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  undefined1 local_c8 [20];
  undefined4 uStack_b4;
  int iStack_b0;
  Allocator *local_a8;
  int iStack_a0;
  int iStack_9c;
  int iStack_98;
  int iStack_94;
  int local_90;
  size_t local_88;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_78 [2];
  long *local_58;
  int local_4c;
  
  local_88 = 0;
  local_c8._0_8_ = (void *)0x0;
  local_c8._8_4_ = 0;
  local_c8._12_4_ = 0;
  local_c8._16_4_ = 0;
  uStack_b4 = 0;
  iStack_b0 = 0;
  local_a8 = (Allocator *)0x0;
  iStack_a0 = 0;
  iStack_9c = 0;
  iStack_98 = 0;
  iStack_94 = 0;
  local_90 = 0;
  ParamDict::get((Mat *)local_78,pd,0,(Mat *)local_c8);
  piVar3 = (int *)CONCAT44(local_c8._12_4_,local_c8._8_4_);
  if (piVar3 != (int *)0x0) {
    LOCK();
    *piVar3 = *piVar3 + -1;
    UNLOCK();
    if (*piVar3 == 0) {
      if (local_a8 == (Allocator *)0x0) {
        if ((void *)local_c8._0_8_ != (void *)0x0) {
          free((void *)local_c8._0_8_);
        }
      }
      else {
        (*local_a8->_vptr_Allocator[3])();
      }
    }
  }
  local_c8._0_8_ = local_c8 + 0x10;
  local_88 = 0;
  uStack_b4 = 0;
  iStack_b0 = 0;
  iStack_a0 = 0;
  iStack_9c = 0;
  iStack_98 = 0;
  iStack_94 = 0;
  local_90 = 0;
  local_c8._8_4_ = 0;
  local_c8._12_4_ = 0;
  local_c8._16_4_ = 0;
  std::__cxx11::string::resize((ulong)local_c8,(char)local_4c);
  this_00 = local_c8._0_8_;
  if (0 < local_4c) {
    lVar7 = 0;
    do {
      *(undefined1 *)((long)&((Layer *)local_c8._0_8_)->_vptr_Layer + lVar7) =
           *(undefined1 *)(local_78[0]._M_allocated_capacity + lVar7 * 4);
      lVar7 = lVar7 + 1;
    } while (local_4c != lVar7);
  }
  iVar4 = std::__cxx11::string::compare(local_c8);
  if (iVar4 == 0) {
    iVar4 = 0;
    std::__cxx11::string::_M_replace
              ((ulong)&this->rhs_token,0,(char *)(this->rhs_token)._M_string_length,0x60358b);
  }
  else {
    pcVar5 = strstr((char *)this_00,"->");
    if (pcVar5 == (char *)0x0) {
      load_param((Einsum *)this_00);
LAB_005a7eeb:
      iVar4 = -1;
    }
    else {
      pcVar5[0] = '\0';
      pcVar5[1] = '\0';
      __s = strtok((char *)this_00,",");
      if (__s != (char *)0x0) {
        do {
          local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
          sVar6 = strlen(__s);
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,__s,__s + sVar6);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     &this->lhs_tokens,&local_e8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
            operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
          }
          __s = strtok((char *)0x0,",");
        } while (__s != (char *)0x0);
      }
      pcVar5 = pcVar5 + 2;
      local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
      sVar6 = strlen(pcVar5);
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,pcVar5,pcVar5 + sVar6);
      std::__cxx11::string::operator=((string *)&this->rhs_token,(string *)&local_e8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
        operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
      }
      sVar11 = (this->rhs_token)._M_string_length;
      if (sVar11 != 0) {
        pEVar1 = (Einsum *)(this->rhs_token)._M_dataplus._M_p;
        sVar8 = 0;
        do {
          if ((byte)(*(char *)((long)&(pEVar1->super_Layer)._vptr_Layer + sVar8) + 0x93U) < 0xfc) {
            load_param(pEVar1);
            goto LAB_005a7eeb;
          }
          sVar8 = sVar8 + 1;
        } while (sVar11 != sVar8);
      }
      pbVar2 = (this->lhs_tokens).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar7 = (long)(this->lhs_tokens).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar2;
      bVar12 = lVar7 != 0;
      if (bVar12) {
        uVar9 = lVar7 >> 5;
        uVar10 = 0;
        do {
          if (pbVar2[uVar10]._M_string_length != 0) {
            pEVar1 = (Einsum *)pbVar2[uVar10]._M_dataplus._M_p;
            sVar11 = 0;
            do {
              if ((byte)(*(char *)((long)&(pEVar1->super_Layer)._vptr_Layer + sVar11) + 0x87U) <
                  0xf0) {
                load_param(pEVar1);
                goto LAB_005a7e69;
              }
              sVar11 = sVar11 + 1;
            } while (pbVar2[uVar10]._M_string_length != sVar11);
          }
          uVar10 = uVar10 + 1;
          bVar12 = uVar10 < uVar9;
        } while (uVar10 != uVar9 + (uVar9 == 0));
      }
LAB_005a7e69:
      iVar4 = -(uint)bVar12;
    }
  }
  if ((Einsum *)local_c8._0_8_ != (Einsum *)(local_c8 + 0x10)) {
    operator_delete((void *)local_c8._0_8_,CONCAT44(uStack_b4,local_c8._16_4_) + 1);
  }
  if ((int *)local_78[0]._8_8_ != (int *)0x0) {
    LOCK();
    *(int *)local_78[0]._8_8_ = *(int *)local_78[0]._8_8_ + -1;
    UNLOCK();
    if (*(int *)local_78[0]._8_8_ == 0) {
      if (local_58 == (long *)0x0) {
        if ((void *)local_78[0]._0_8_ != (void *)0x0) {
          free((void *)local_78[0]._0_8_);
        }
      }
      else {
        (**(code **)(*local_58 + 0x18))();
      }
    }
  }
  return iVar4;
}

Assistant:

int Einsum::load_param(const ParamDict& pd)
{
    Mat equation_mat = pd.get(0, Mat());

    const int equation_len = equation_mat.w;

    // restore to lexical equation string
    std::string equation;
    equation.resize(equation_len);
    char* equation_ptr = (char*)equation.c_str();
    {
        const int* p = equation_mat;
        for (int i = 0; i < equation_len; i++)
        {
            equation_ptr[i] = p[i];
        }
    }

    if (equation == "ii")
    {
        // trace
        rhs_token = "ii";

        return 0;
    }

    // split into tokens
    char* arrow = strstr(equation_ptr, "->");
    if (!arrow)
    {
        NCNN_LOGE("invalid equation %s", equation_ptr);
        return -1;
    }

    arrow[0] = '\0';
    arrow[1] = '\0';

    char* lhs = equation_ptr;
    char* rhs = arrow + 2;

    {
        char* t = strtok(lhs, ",");
        while (t)
        {
            lhs_tokens.push_back(std::string(t));
            t = strtok(NULL, ",");
        }
    }

    rhs_token = std::string(rhs);

    // check token always in ijkl
    {
        for (size_t i = 0; i < rhs_token.size(); i++)
        {
            if (rhs_token[i] < 'i' || rhs_token[i] > 'l')
            {
                NCNN_LOGE("invalid rhs_token %s", rhs_token.c_str());
                return -1;
            }
        }

        for (size_t i = 0; i < lhs_tokens.size(); i++)
        {
            const std::string& lhs_token = lhs_tokens[i];
            for (size_t j = 0; j < lhs_token.size(); j++)
            {
                if (lhs_token[j] < 'i' || lhs_token[j] > 'x')
                {
                    NCNN_LOGE("invalid lhs_token %s", lhs_token.c_str());
                    return -1;
                }
            }
        }
    }

    return 0;
}